

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::H_formatter<spdlog::details::null_scoped_padder>::format
          (H_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  ulong local_28 [2];
  
  uVar1 = tm_time->tm_hour;
  local_28[0] = (ulong)uVar1;
  if (local_28[0] < 100) {
    bVar2 = (byte)((uVar1 & 0xff) / 10);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar4 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar4 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar2 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar4 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar4 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar2 * -10 | 0x30;
  }
  else {
    format_str.size_ = 5;
    format_str.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
          *)local_28;
    args.types_ = 2;
    fmt::v6::
    vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              ((range)dest,format_str,args,(locale_ref)0x0);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_hour, dest);
    }